

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext_conflict1 *pIVar1;
  _Bool _Var2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImU32 col;
  int iVar4;
  int idx;
  float fVar5;
  float fVar6;
  bool held;
  bool hovered;
  ImVec2 size_local;
  float local_68;
  ImRect bb;
  
  pIVar1 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    size_local = size;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    bb.Min.x = (this->DC).CursorPos.x;
    bb.Min.y = (this->DC).CursorPos.y;
    local_68 = size.x;
    bb.Max.x = local_68 + bb.Min.x;
    bb.Max.y = size.y + bb.Min.y;
    fVar5 = GetFrameHeight();
    if (fVar5 <= size.y) {
      fVar5 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar5 = -1.0;
    }
    ItemSize(&size_local,fVar5);
    bVar3 = false;
    _Var2 = ItemAdd(&bb,id,(ImRect *)0x0,0);
    if (_Var2) {
      bVar3 = ButtonBehavior(&bb,id,&hovered,&held,
                             ((pIVar1->LastItemData).InFlags & 2U) << 9 | flags);
      iVar4 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar4;
      }
      if (held == false) {
        idx = iVar4;
      }
      fill_col = GetColorU32(idx,1.0);
      col = GetColorU32(0,1.0);
      RenderNavHighlight(&bb,id,1);
      p_min.y = bb.Min.y;
      p_min.x = bb.Min.x;
      p_max.y = bb.Max.y;
      p_max.x = bb.Max.x;
      RenderFrame(p_min,p_max,fill_col,true,(pIVar1->Style).FrameRounding);
      fVar5 = (size_local.x - pIVar1->FontSize) * 0.5;
      fVar6 = (size_local.y - pIVar1->FontSize) * 0.5;
      pos.y = bb.Min.y + (float)(-(uint)(0.0 < fVar6) & (uint)fVar6);
      pos.x = bb.Min.x + (float)(-(uint)(0.0 < fVar5) & (uint)fVar5);
      RenderArrow(this->DrawList,pos,col,dir,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}